

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O0

void __thiscall Game::play(Game *this)

{
  bool bVar1;
  GameResult GVar2;
  bool local_21;
  Game *this_local;
  
  printIntro(this);
  while( true ) {
    bVar1 = hasWon(this);
    local_21 = false;
    if (!bVar1) {
      local_21 = hasTries(this);
    }
    if (local_21 == false) break;
    GVar2 = getGuess(this);
    this->gameResult = GVar2;
    this->guessCount = this->guessCount + 1;
    printGuessResult(this);
  }
  promptUserToPlayAgain(this);
  if ((this->wantsToPlay & 1U) != 0) {
    resetGame(this);
  }
  return;
}

Assistant:

void Game::play()
{
	printIntro();
	// while player has not won or limit of retries has not been reached
	while (not hasWon() and hasTries()) // play the game
	{
		gameResult = getGuess();
		++guessCount;
		printGuessResult();
	}
	promptUserToPlayAgain();
	if (wantsToPlay)
		resetGame();
}